

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O0

tls_object * __thiscall booster::details::pthread_key::get_object(pthread_key *this)

{
  tls_object *in_RDI;
  tls_object *res;
  void *p;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  intrusive_ptr<booster::details::key> *in_stack_ffffffffffffffd0;
  tls_object *local_8;
  
  local_8 = (tls_object *)pthread_getspecific(*(pthread_key_t *)&in_RDI[1].obj);
  if (local_8 == (tls_object *)0x0) {
    local_8 = (tls_object *)operator_new(0x10);
    intrusive_ptr<booster::details::key>::intrusive_ptr
              (in_stack_ffffffffffffffd0,
               (key *)CONCAT44(in_stack_ffffffffffffffcc,CONCAT13(1,(int3)in_stack_ffffffffffffffc8)
                              ),SUB81((ulong)in_RDI >> 0x38,0));
    tls_object::tls_object(in_RDI,&local_8->the_key);
    intrusive_ptr<booster::details::key>::~intrusive_ptr(&in_RDI->the_key);
    pthread_setspecific(*(pthread_key_t *)&in_RDI[1].obj,local_8);
  }
  return local_8;
}

Assistant:

tls_object *get_object()
			{
				void *p=pthread_getspecific(key_);
				if(p)
					return static_cast<tls_object*>(p);
				tls_object *res = new tls_object(intrusive_ptr<key>(this));
				pthread_setspecific(key_,static_cast<void*>(res));
				return res;
			}